

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O1

void __thiscall
lexical::analyse(lexical *this,
                vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                *lines)

{
  char cVar1;
  int iVar2;
  element_type *peVar3;
  pointer pcVar4;
  size_type sVar5;
  iterator ch;
  lexical *this_00;
  bool bVar6;
  int iVar7;
  iterator it;
  iterator local_90;
  lexical *local_88;
  Meta local_80;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  local_58 = (lines->
             super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (lines->
             super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_58 != local_60) {
    local_88 = this;
    do {
      peVar3 = (local_58->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pcVar4 = (peVar3->text)._M_dataplus._M_p;
      sVar5 = (peVar3->text)._M_string_length;
      if (sVar5 != 0) {
        iVar2 = peVar3->line;
        local_90._M_current = pcVar4;
        do {
          ch._M_current = local_90._M_current;
          local_80.column = ((int)local_90._M_current - (int)pcVar4) + 1;
          local_80.cur_begin._M_current = local_90._M_current;
          local_80.line = iVar2;
          local_80.begin._M_current = pcVar4;
          local_80.end._M_current = pcVar4 + sVar5;
          bVar6 = sutil::is_blank(local_90._M_current);
          if (bVar6) {
            local_90._M_current = ch._M_current + 1;
          }
          else {
            bVar6 = sutil::is_key(ch._M_current,true);
            if (bVar6) {
              analyse_identifier(local_88,&local_90,&local_80);
            }
            else {
              cVar1 = *ch._M_current;
              if ((int)cVar1 - 0x30U < 10) {
LAB_0010a735:
                analyse_number(local_88,&local_90,&local_80);
              }
              else if (cVar1 == '.') {
                if ((int)ch._M_current[1] - 0x30U < 10) goto LAB_0010a735;
LAB_0010a7a8:
                this_00 = local_88;
                bVar6 = Table::in_delimiter(&local_88->table,ch._M_current);
                if (bVar6) {
                  analyse_delimiter(this_00,&local_90,&local_80);
                }
                else {
                  bVar6 = Table::in_operator(&this_00->table,ch._M_current);
                  if (bVar6) {
                    analyse_operator(this_00,&local_90,&local_80);
                  }
                  else if (*ch._M_current == '\"') {
                    analyse_string(local_88,&local_90,&local_80);
                  }
                  else if (*ch._M_current == '\'') {
                    analyse_char(local_88,&local_90,&local_80);
                  }
                  else {
                    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_50,anon_var_dwarf_320c0,anon_var_dwarf_320c0 + 0xf);
                    error(local_88,&local_90,&local_80,&local_50);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p);
                    }
                  }
                }
              }
              else {
                if (cVar1 != '@') {
                  if ((cVar1 != '0') || (iVar7 = tolower((int)cVar1), iVar7 != 0x78))
                  goto LAB_0010a7a8;
                  goto LAB_0010a735;
                }
                analyse_annotation(local_88,&local_90,&local_80);
              }
            }
          }
        } while (local_90._M_current != pcVar4 + sVar5);
      }
      local_58 = local_58 + 1;
    } while (local_58 != local_60);
  }
  return;
}

Assistant:

void lexical::analyse(vector<shared_ptr<StringLine>> lines) {
    Meta meta;
    for (const auto &line : lines) {
        auto begin = line->get_text().begin();
        auto end = line->get_text().end();
        auto it = begin;
        int lineNumber = line->get_line();
        while (it != end) {
            int column = it - begin + 1;
            meta = Meta(lineNumber, column, it, begin, end);
            //空白字符不判断
            if (sutil::is_blank(*it)) {
                ++it;
                continue;
            }
            if (sutil::is_key(*it, true)) {
                if (analyse_identifier(it, meta)) continue;
            } else if (isdigit(*it) || (*it == '0' && tolower(*it) == 'x') || (*it == '.' && isdigit(*(it + 1)))) {
                if (analyse_number(it, meta))continue;
            } else if (*it == '@') {
                if (analyse_annotation(it, meta))continue;
            } else if (table.in_delimiter(*it)) {
                if (analyse_delimiter(it, meta))continue;
            } else if (table.in_operator(*it)) {
                if (analyse_operator(it, meta))continue;
            } else if (*it == '\'') {
                if (analyse_char(it, meta))continue;
            } else if (*it == '\"') {
                if (analyse_string(it, meta))continue;
            } else {
                error(it, meta, "非法的字符");
            }
        }
    }
}